

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::push_back
          (small_vector<unsigned_char,_128UL> *this,uchar *v)

{
  value_type vVar1;
  bool bVar2;
  size_t elements;
  reference pvVar3;
  size_t new_elements;
  uchar *v_local;
  small_vector<unsigned_char,_128UL> *this_local;
  
  elements = this->elements_ + 1;
  bVar2 = is_small(elements);
  if (bVar2) {
    vVar1 = *v;
    pvVar3 = std::array<unsigned_char,_128UL>::operator[](&this->small_buffer_,this->elements_);
    *pvVar3 = vVar1;
  }
  else {
    bVar2 = is_small(this->elements_);
    if (bVar2) {
      switch_to_big(this,elements);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->big_buffer_,v);
    set_buffer_ptr(this,elements);
  }
  this->elements_ = elements;
  return;
}

Assistant:

inline void small_vector<ElementType, BodyElements>::push_back (ElementType const & v) {
        auto const new_elements = elements_ + 1U;
        if (is_small (new_elements)) {
            small_buffer_[elements_] = v;
        } else {
            if (is_small (elements_)) {
                this->switch_to_big (new_elements);
            }
            big_buffer_.push_back (v);
            this->set_buffer_ptr (new_elements);
        }
        elements_ = new_elements;
    }